

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dot_product_with_scale.c
# Opt level: O3

int32_t WebRtcSpl_DotProductWithScale(int16_t *vector1,int16_t *vector2,size_t length,int scaling)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  size_t sVar6;
  
  iVar2 = 0;
  iVar3 = 0;
  bVar4 = (byte)scaling;
  if (length < 4) {
    sVar6 = 0;
  }
  else {
    uVar1 = 3;
    do {
      uVar5 = uVar1;
      iVar2 = ((int)vector2[uVar5] * (int)vector1[uVar5] >> (bVar4 & 0x1f)) +
              ((int)vector2[uVar5 - 1] * (int)vector1[uVar5 - 1] >> (bVar4 & 0x1f)) +
              ((int)vector2[uVar5 - 2] * (int)vector1[uVar5 - 2] >> (bVar4 & 0x1f)) +
              ((int)vector2[uVar5 - 3] * (int)vector1[uVar5 - 3] >> (bVar4 & 0x1f)) + iVar2;
      uVar1 = uVar5 + 4;
    } while (uVar5 + 4 < length);
    sVar6 = uVar5 + 1;
    iVar3 = iVar2;
  }
  if (sVar6 < length) {
    do {
      iVar3 = iVar3 + ((int)vector2[sVar6] * (int)vector1[sVar6] >> (bVar4 & 0x1f));
      sVar6 = sVar6 + 1;
    } while (length != sVar6);
  }
  return iVar3;
}

Assistant:

int32_t WebRtcSpl_DotProductWithScale(const int16_t* vector1,
                                      const int16_t* vector2,
                                      size_t length,
                                      int scaling) {
  int32_t sum = 0;
  size_t i = 0;

  /* Unroll the loop to improve performance. */
  for (i = 0; i + 3 < length; i += 4) {
    sum += (vector1[i + 0] * vector2[i + 0]) >> scaling;
    sum += (vector1[i + 1] * vector2[i + 1]) >> scaling;
    sum += (vector1[i + 2] * vector2[i + 2]) >> scaling;
    sum += (vector1[i + 3] * vector2[i + 3]) >> scaling;
  }
  for (; i < length; i++) {
    sum += (vector1[i] * vector2[i]) >> scaling;
  }

  return sum;
}